

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint
          (ConstraintsGroupPimpl *this,shared_ptr<iDynTree::optimalcontrol::Constraint> *constraint,
          TimeRange *timeRange)

{
  Constraint *this_00;
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  long lVar4;
  double dVar5;
  element_type *peVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  string *psVar10;
  iterator iVar11;
  ostream *poVar12;
  ulong uVar13;
  char *pcVar14;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  pVar15;
  TimedConstraint_ptr newConstraint;
  SparsityStructure newConstraintControlHessianSparsity;
  SparsityStructure newConstraintStateHessianSparsity;
  SparsityStructure newConstraintMixedHessianSparsity;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> local_288;
  SparsityStructure local_278;
  undefined1 local_210 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  ios_base local_1a0 [264];
  SparsityStructure local_98;
  
  this_00 = (constraint->
            super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  if (this_00 == (Constraint *)0x0) {
    pcVar14 = "Empty constraint pointer.";
LAB_0017aeb4:
    iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar14);
    return false;
  }
  sVar9 = Constraint::constraintSize(this_00);
  if (this->maxConstraintSize < sVar9) {
    pcVar14 = "The constraint dimension is greater than the maximum allowed by the group.";
    goto LAB_0017aeb4;
  }
  TimeRange::AnyTime();
  bVar7 = TimeRange::operator==(timeRange,(TimeRange *)local_210);
  if (bVar7) {
    if ((this->group)._M_h._M_element_count != 0) {
      pcVar14 = "Only one constraint is allowed in a group if the timeRange is AnyTime.";
      goto LAB_0017aeb4;
    }
  }
  else {
    bVar7 = TimeRange::isValid(timeRange);
    if (!bVar7) {
      pcVar14 = "Invalid timeRange.";
      goto LAB_0017aeb4;
    }
  }
  if ((this->group)._M_h._M_element_count != 0) {
    psVar10 = Constraint::name_abi_cxx11_
                        ((constraint->
                         super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
    iVar11 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this,psVar10);
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_210,"A constraint named ",0x13);
      psVar10 = Constraint::name_abi_cxx11_
                          ((constraint->
                           super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,(psVar10->_M_dataplus)._M_p,
                           psVar10->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," already exists in the group ",0x1d);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," .",2);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","addConstraint",(char *)local_278.m_register._M_h._M_buckets);
      if ((__node_base *)local_278.m_register._M_h._M_buckets !=
          &local_278.m_register._M_h._M_before_begin) {
        operator_delete(local_278.m_register._M_h._M_buckets,
                        (ulong)((long)&(local_278.m_register._M_h._M_before_begin._M_nxt)->_M_nxt +
                               1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      std::ios_base::~ios_base(local_1a0);
      if (iVar11.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        return false;
      }
    }
  }
  local_288.
  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimedConstraint,std::allocator<iDynTree::optimalcontrol::TimedConstraint>>
            (&local_288.
              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(anon_struct_184_6_88621fe5 **)&local_288,
             (allocator<iDynTree::optimalcontrol::TimedConstraint> *)local_210);
  ((local_288.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_anyTime = timeRange->m_anyTime;
  dVar5 = timeRange->m_endTime;
  ((local_288.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_initTime = timeRange->m_initTime;
  ((local_288.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_endTime = dVar5;
  ((local_288.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->constraint).
  super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (constraint->
       super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_288.
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->constraint).
              super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(constraint->
              super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  peVar6 = local_288.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  Constraint::constraintSize
            ((constraint->
             super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  iDynTree::VectorDynSize::resize((ulong)&peVar6->constraintBuffer);
  peVar6 = local_288.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar9 = Constraint::constraintSize
                    ((constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  (*((constraint->
     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Constraint[6])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar6->stateJacobianBuffer,sVar9 & 0xffffffff);
  peVar6 = local_288.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar9 = Constraint::constraintSize
                    ((constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  (*((constraint->
     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Constraint[7])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar6->controlJacobianBuffer,sVar9 & 0xffffffff);
  peVar6 = local_288.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  Constraint::constraintSize
            ((constraint->
             super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  iDynTree::VectorDynSize::resize((ulong)&peVar6->lambdaBuffer);
  psVar10 = Constraint::name_abi_cxx11_
                      ((constraint->
                       super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  ::pair<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
              *)local_210,psVar10,&local_288);
  pVar15 = std::
           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>
                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)this,local_210);
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_210,"Unable to add constraint ",0x19);
    psVar10 = Constraint::name_abi_cxx11_
                        ((constraint->
                         super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("ConstraintsGroup","addConstraint",(char *)local_278.m_register._M_h._M_buckets);
    if ((__node_base *)local_278.m_register._M_h._M_buckets !=
        &local_278.m_register._M_h._M_before_begin) {
      operator_delete(local_278.m_register._M_h._M_buckets,
                      (ulong)((long)&(local_278.m_register._M_h._M_before_begin._M_nxt)->_M_nxt + 1)
                     );
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
  }
  else {
    std::
    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
    ::push_back(&this->orderedIntervals,
                (value_type *)
                ((long)pVar15.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
                + 0x28));
    psVar1 = (this->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar1 != psVar2) {
      uVar13 = (long)psVar2 - (long)psVar1 >> 4;
      lVar4 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint(std::shared_ptr<iDynTree::optimalcontrol::Constraint>,iDynTree::optimalcontrol::TimeRange_const&)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
                (psVar1,psVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint(std::shared_ptr<iDynTree::optimalcontrol::Constraint>,iDynTree::optimalcontrol::TimeRange_const&)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
                (psVar1,psVar2);
    }
    SparsityStructure::SparsityStructure((SparsityStructure *)local_210);
    SparsityStructure::SparsityStructure(&local_278);
    if ((this->stateJacobianSparsityProvided != true) ||
       (peVar3 = (constraint->
                 super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr, iVar8 = (*peVar3->_vptr_Constraint[8])(peVar3,local_210),
       (char)iVar8 == '\0')) {
      this->stateJacobianSparsityProvided = false;
LAB_0017afa3:
      if ((this->controlJacobianSparsityProvided == true) &&
         (peVar3 = (constraint->
                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar8 = (*peVar3->_vptr_Constraint[9])(peVar3,&local_278),
         (char)iVar8 != '\0')) {
        bVar7 = SparsityStructure::isValid(&local_278);
        if (!bVar7) {
          pcVar14 = 
          "The control sparsity is provided but the dimension of the two vectors do not match.";
          goto LAB_0017b114;
        }
        SparsityStructure::merge(&this->groupControlJacobianSparsity,&local_278);
      }
      else {
        this->controlJacobianSparsityProvided = false;
      }
      SparsityStructure::~SparsityStructure(&local_278);
      SparsityStructure::~SparsityStructure((SparsityStructure *)local_210);
      SparsityStructure::SparsityStructure((SparsityStructure *)local_210);
      SparsityStructure::SparsityStructure(&local_278);
      SparsityStructure::SparsityStructure(&local_98);
      if ((this->stateHessianSparsityProvided == true) &&
         (peVar3 = (constraint->
                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar8 = (*peVar3->_vptr_Constraint[0xd])(peVar3,local_210),
         (char)iVar8 != '\0')) {
        bVar7 = SparsityStructure::isValid((SparsityStructure *)local_210);
        if (bVar7) {
          SparsityStructure::merge(&this->groupStateHessianSparsity,(SparsityStructure *)local_210);
          goto LAB_0017b066;
        }
        pcVar14 = 
        "The state hessian sparsity is provided but the dimension of the two vectors do not match.";
LAB_0017b159:
        iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar14);
        bVar7 = false;
      }
      else {
        this->stateHessianSparsityProvided = false;
LAB_0017b066:
        if ((this->controlHessianSparsityProvided == true) &&
           (peVar3 = (constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, iVar8 = (*peVar3->_vptr_Constraint[0xf])(peVar3,&local_278),
           (char)iVar8 != '\0')) {
          bVar7 = SparsityStructure::isValid(&local_278);
          if (!bVar7) {
            pcVar14 = 
            "The control hessian sparsity is provided but the dimension of the two vectors do not match."
            ;
            goto LAB_0017b159;
          }
          SparsityStructure::merge(&this->groupControlHessianSparsity,&local_278);
        }
        else {
          this->controlHessianSparsityProvided = false;
        }
        if ((this->mixedHessianSparsityProvided == true) &&
           (peVar3 = (constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, iVar8 = (*peVar3->_vptr_Constraint[0xe])(peVar3,&local_98),
           (char)iVar8 != '\0')) {
          bVar7 = SparsityStructure::isValid(&local_98);
          if (!bVar7) {
            pcVar14 = 
            "The state control hessian sparsity is provided but the dimension of the two vectors do not match."
            ;
            goto LAB_0017b159;
          }
          bVar7 = true;
          SparsityStructure::merge(&this->groupMixedHessianSparsity,&local_98);
        }
        else {
          this->mixedHessianSparsityProvided = false;
          bVar7 = true;
        }
      }
      SparsityStructure::~SparsityStructure(&local_98);
      SparsityStructure::~SparsityStructure(&local_278);
      SparsityStructure::~SparsityStructure((SparsityStructure *)local_210);
      goto LAB_0017b18f;
    }
    bVar7 = SparsityStructure::isValid((SparsityStructure *)local_210);
    if (bVar7) {
      SparsityStructure::merge(&this->groupStateJacobianSparsity,(SparsityStructure *)local_210);
      goto LAB_0017afa3;
    }
    pcVar14 = "The state sparsity is provided but the dimension of the two vectors do not match.";
LAB_0017b114:
    iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar14);
    SparsityStructure::~SparsityStructure(&local_278);
    SparsityStructure::~SparsityStructure((SparsityStructure *)local_210);
  }
  bVar7 = false;
LAB_0017b18f:
  if (local_288.
      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.
               super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool addConstraint(std::shared_ptr<Constraint> constraint, const TimeRange &timeRange)
            {
                if (!constraint){
                    reportError("ConstraintsGroup", "addConstraint", "Empty constraint pointer.");
                    return false;
                }

                if (constraint->constraintSize() > maxConstraintSize){
                    reportError("ConstraintsGroup", "addConstraint", "The constraint dimension is greater than the maximum allowed by the group.");
                    return false;
                }

                if (timeRange == TimeRange::AnyTime()){
                    if (group.size() != 0){
                        reportError("ConstraintsGroup", "addConstraint",
                                    "Only one constraint is allowed in a group if the timeRange is AnyTime.");
                        return false;
                    }
                } else {
                    if (!timeRange.isValid()){
                        reportError("ConstraintsGroup", "addConstraint", "Invalid timeRange.");
                        return false;
                    }
                }

                if(group.size() > 0){
                    GroupOfConstraintsMap::iterator constraintIterator;
                    constraintIterator = group.find(constraint->name());
                    if(constraintIterator != group.end()){
                        std::ostringstream errorMsg;
                        errorMsg << "A constraint named " << constraint->name()
                                 <<" already exists in the group "<< name << " .";
                        reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                        return false;
                    }
                }

                //add constraints in the group
                TimedConstraint_ptr newConstraint = std::make_shared<TimedConstraint>();

                newConstraint->timeRange = timeRange;
                newConstraint->constraint = constraint;
                newConstraint->constraintBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));
                newConstraint->stateJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedStateSpaceSize()));
                newConstraint->controlJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedControlSpaceSize()));
                newConstraint->lambdaBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));


                std::pair< GroupOfConstraintsMap::iterator, bool> result;
                result = group.insert(GroupOfConstraintsMap::value_type(constraint->name(), newConstraint));

                if(!result.second){
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to add constraint "<<constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                    return false;
                }

                orderedIntervals.push_back(result.first->second); //register the time range in order to have the constraints ordered by init time. result.first->second is the TimedConstraint_ptr of the newly inserted TimedConstraint.
                std::sort(orderedIntervals.begin(), orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector

                {
                    SparsityStructure newConstraintStateJacobianSparsity, newConstraintControlJacobianSparsity;

                    if (stateJacobianSparsityProvided
                        && constraint->constraintJacobianWRTStateSparsity(newConstraintStateJacobianSparsity)) {

                        if (!newConstraintStateJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The state sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupStateJacobianSparsity.merge(newConstraintStateJacobianSparsity);

                    } else {
                        stateJacobianSparsityProvided = false;
                    }

                    if (controlJacobianSparsityProvided
                        && constraint->constraintJacobianWRTControlSparsity(newConstraintControlJacobianSparsity)) {

                        if (!newConstraintControlJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The control sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupControlJacobianSparsity.merge(newConstraintControlJacobianSparsity);

                    } else {
                        controlJacobianSparsityProvided = false;
                    }
                }

                SparsityStructure newConstraintStateHessianSparsity, newConstraintControlHessianSparsity, newConstraintMixedHessianSparsity;

                if (stateHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateSparsity(newConstraintStateHessianSparsity)) {

                    if (!newConstraintStateHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupStateHessianSparsity.merge(newConstraintStateHessianSparsity);

                } else {
                    stateHessianSparsityProvided = false;
                }

                if (controlHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTControlSparsity(newConstraintControlHessianSparsity)) {

                    if (!newConstraintControlHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupControlHessianSparsity.merge(newConstraintControlHessianSparsity);

                } else {
                    controlHessianSparsityProvided = false;
                }

                if (mixedHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateControlSparsity(newConstraintMixedHessianSparsity)) {

                    if (!newConstraintMixedHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupMixedHessianSparsity.merge(newConstraintMixedHessianSparsity);

                } else {
                    mixedHessianSparsityProvided = false;
                }

                return true;
            }